

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_fma.cpp
# Opt level: O2

void __thiscall ncnn::MatMul_x86_fma::create_pipeline(MatMul_x86_fma *this)

{
  Option *in_RSI;
  
  create_pipeline((MatMul_x86_fma *)
                  ((long)&this->_vptr_MatMul_x86_fma + (long)this->_vptr_MatMul_x86_fma[-6]),in_RSI)
  ;
  return;
}

Assistant:

int MatMul_x86_fma::create_pipeline(const Option& opt)
{
    gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

    ncnn::ParamDict pd;
    pd.set(2, 0);      // transA
    pd.set(3, transB); // transB
    pd.set(4, 0);      // constantA
    pd.set(5, 0);      // constantB
    pd.set(6, 1);      // constantC
    pd.set(7, 0);      // M = outch
    pd.set(8, 0);      // N = size
    pd.set(9, 0);      // K = maxk*inch
    pd.set(10, -1);    // constant_broadcast_type_C = null
    pd.set(11, 0);     // output_N1M
    pd.set(12, 1);     // output_elempack

    gemm->load_param(pd);

    gemm->load_model(ModelBinFromMatArray(0));

    gemm->create_pipeline(opt);

    return 0;
}